

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

Nf_Man_t * Nf_StoCreate(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  Vec_Flt_t *p;
  Jf_Par_t *pJVar1;
  Mio_Cell2_t *pMVar2;
  int iVar3;
  Nf_Man_t *pNVar4;
  abctime aVar5;
  Nf_Obj_t *pNVar6;
  Vec_Int_t *pVVar7;
  Mio_Library_t *pLib;
  int i;
  int i_00;
  float Entry;
  float Entry_00;
  
  if (0x1e < pPars->nCutNum - 2U) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= NF_CUT_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                  ,0x172,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if (4 < pPars->nLutSize - 2U) {
    __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                  ,0x173,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  pVVar7 = pGia->vCellMapping;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pGia->vCellMapping->pArray = (int *)0x0;
      pVVar7 = pGia->vCellMapping;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_005d574d;
    }
    free(pVVar7);
    pGia->vCellMapping = (Vec_Int_t *)0x0;
  }
LAB_005d574d:
  if (pGia->pSibls != (int *)0x0) {
    Gia_ManSetPhase(pGia);
  }
  pNVar4 = (Nf_Man_t *)calloc(1,0x120);
  aVar5 = Abc_Clock();
  pNVar4->clkStart = aVar5;
  pNVar4->pGia = pGia;
  pNVar4->pPars = pPars;
  pNVar6 = (Nf_Obj_t *)calloc((long)pGia->nObjs,0x40);
  pNVar4->pNfObjs = pNVar6;
  pNVar4->iCur = 2;
  Vec_PtrGrow(&pNVar4->vPages,0x100);
  Vec_IntFill(&pNVar4->vMapRefs,pGia->nObjs * 2,0);
  p = &pNVar4->vFlowRefs;
  Vec_FltFill(p,pGia->nObjs * 2,Entry);
  Vec_IntFill(&pNVar4->vRequired,pGia->nObjs * 2,0x3fffffff);
  Vec_IntFill(&pNVar4->vCutSets,pGia->nObjs,0);
  Vec_FltFill(&pNVar4->vCutFlows,pGia->nObjs,Entry_00);
  Vec_IntFill(&pNVar4->vCutDelays,pGia->nObjs,0);
  Vec_IntGrow(&pNVar4->vBackup,1000);
  pVVar7 = Vec_IntAlloc(0);
  Mf_ManSetFlowRefs(pGia,pVVar7);
  i_00 = 1;
  for (i = 0; i < pVVar7->nSize; i = i + 1) {
    iVar3 = Vec_IntEntry(pVVar7,i);
    Vec_FltWriteEntry(p,i_00 + -1,(float)iVar3);
    Vec_FltWriteEntry(p,i_00,(float)iVar3);
    i_00 = i_00 + 2;
  }
  Vec_IntFree(pVVar7);
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  pJVar1 = pNVar4->pPars;
  Mio_LibraryMatchesFetch
            (pLib,&pNVar4->vTtMem,&pNVar4->vTt2Match,&pNVar4->pCells,&pNVar4->nCells,
             pJVar1->fPinFilter,pJVar1->fPinPerm,pJVar1->fPinQuick);
  pMVar2 = pNVar4->pCells;
  pNVar4->InvDelayI = pMVar2[3].iDelays[0];
  pNVar4->InvAreaW = pMVar2[3].AreaW;
  pNVar4->InvAreaF = pMVar2[3].AreaF;
  *(uint *)pNVar4->pNfObjs->M[0] = *(uint *)pNVar4->pNfObjs->M[0] & 0xfff00000;
  *(uint *)pNVar4->pNfObjs->M[1] = (*(uint *)pNVar4->pNfObjs->M[1] & 0xfff00000) + 1;
  return pNVar4;
}

Assistant:

Nf_Man_t * Nf_StoCreate( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    extern void Mf_ManSetFlowRefs( Gia_Man_t * p, Vec_Int_t * vRefs );
    Vec_Int_t * vFlowRefs;
    Nf_Man_t * p;
    int i, Entry;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= NF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vCellMapping );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    // create
    p = ABC_CALLOC( Nf_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->pGia     = pGia;
    p->pPars    = pPars;
    p->pNfObjs  = ABC_CALLOC( Nf_Obj_t, Gia_ManObjNum(pGia) );
    p->iCur     = 2;
    // other
    Vec_PtrGrow( &p->vPages, 256 );                                    // cut memory
    Vec_IntFill( &p->vMapRefs,  2*Gia_ManObjNum(pGia), 0 );            // mapping refs   (2x)
    Vec_FltFill( &p->vFlowRefs, 2*Gia_ManObjNum(pGia), 0 );            // flow refs      (2x)
    Vec_IntFill( &p->vRequired, 2*Gia_ManObjNum(pGia), SCL_INFINITY ); // required times (2x)
    Vec_IntFill( &p->vCutSets,  Gia_ManObjNum(pGia), 0 );              // cut offsets
    Vec_FltFill( &p->vCutFlows, Gia_ManObjNum(pGia), 0 );              // cut area
    Vec_IntFill( &p->vCutDelays,Gia_ManObjNum(pGia), 0 );              // cut delay
    Vec_IntGrow( &p->vBackup, 1000 );
    // references
    vFlowRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs( pGia, vFlowRefs );
    Vec_IntForEachEntry( vFlowRefs, Entry, i )
    {
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i,   /*0.5* */Entry );
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i+1, /*0.5* */Entry );
    }
    Vec_IntFree(vFlowRefs);
    // matching
    Mio_LibraryMatchesFetch( (Mio_Library_t *)Abc_FrameReadLibGen(), &p->vTtMem, &p->vTt2Match, &p->pCells, &p->nCells, p->pPars->fPinFilter, p->pPars->fPinPerm, p->pPars->fPinQuick );
    p->InvDelayI = p->pCells[3].iDelays[0];
    p->InvAreaW  = p->pCells[3].AreaW;
    p->InvAreaF  = p->pCells[3].AreaF;
    Nf_ObjMatchD(p, 0, 0)->Gate = 0;
    Nf_ObjMatchD(p, 0, 1)->Gate = 1;
    // prepare cuts
    return p;
}